

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O1

int VP8EncLoop(VP8Encoder *enc)

{
  uint64_t *puVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  VP8RDLevel rd_opt;
  size_t sVar5;
  size_t sVar6;
  score_t sVar7;
  VP8Encoder *pVVar8;
  VP8BitWriter *bw;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint64_t uVar16;
  int16_t (*paiVar17) [16];
  int16_t (*paiVar18) [16];
  int16_t (*paiVar19) [16];
  long lVar20;
  uint uVar21;
  int *piVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  VP8Residual res_1;
  VP8Residual res;
  VP8ModeScore info;
  VP8EncIterator it;
  PassStats local_1320;
  double local_12e8;
  double dStack_12e0;
  VP8Residual local_12d8;
  VP8ModeScore local_12a8;
  VP8EncIterator local_f38;
  
  iVar9 = PreLoopInitialize(enc);
  if (iVar9 == 0) {
    iVar9 = 0;
  }
  else {
    iVar9 = enc->method;
    iVar13 = enc->do_search;
    iVar14 = enc->config->pass;
    iVar10 = (iVar14 / 2 + 0x14) / iVar14;
    iVar3 = enc->percent;
    iVar11 = enc->mb_h * enc->mb_w;
    InitPassStats(enc,&local_1320);
    memset((enc->proba).stats,0,0x1080);
    iVar15 = iVar11;
    if ((iVar9 == 3 || iVar9 == 0) && iVar13 == 0) {
      if (iVar9 == 3) {
        iVar12 = iVar11 >> 1;
        iVar15 = 100;
      }
      else {
        iVar12 = iVar11 >> 2;
        iVar15 = 0x32;
      }
      if (200 < iVar11) {
        iVar15 = iVar12;
      }
    }
    if (0 < iVar14) {
      lVar20 = (long)iVar15 * 0x180;
      auVar33._8_4_ = (int)((ulong)lVar20 >> 0x20);
      auVar33._0_8_ = lVar20;
      auVar33._12_4_ = 0x45300000;
      dStack_12e0 = auVar33._8_8_ - 1.9342813113834067e+25;
      local_12e8 = (dStack_12e0 + ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0)) *
                   65025.0;
      do {
        bVar30 = true;
        if ((0.4 < ABS(local_1320.dq)) && (iVar14 != 1)) {
          bVar30 = enc->max_i4_header_bits == 0;
        }
        VP8IteratorInit(enc,&local_f38);
        SetLoopParams(enc,local_1320.q);
        lVar24 = 0;
        lVar28 = 0;
        lVar20 = 0;
        iVar11 = iVar15;
        do {
          VP8IteratorImport(&local_f38,(uint8_t *)0x0);
          iVar12 = VP8Decimate(&local_f38,&local_12a8,(uint)(2 < iVar9 || iVar13 != 0));
          pVVar8 = local_f38.enc;
          if (iVar12 != 0) {
            piVar22 = &(enc->proba).nb_skip;
            *piVar22 = *piVar22 + 1;
          }
          VP8IteratorNzToBytes(&local_f38);
          bVar31 = ((uint)*local_f38.mb & 3) != 1;
          if (bVar31) {
            iVar12 = 3;
          }
          else {
            VP8InitResidual(0,1,pVVar8,&local_12d8);
            (*VP8SetResidualCoeffs)(local_12a8.y_dc_levels,&local_12d8);
            local_f38.top_nz[8] =
                 VP8RecordCoeffs(local_f38.left_nz[8] + local_f38.top_nz[8],&local_12d8);
            iVar12 = 0;
            local_f38.left_nz[8] = local_f38.top_nz[8];
          }
          VP8InitResidual((uint)!bVar31,iVar12,pVVar8,&local_12d8);
          paiVar17 = local_12a8.y_ac_levels;
          lVar23 = 0;
          do {
            lVar26 = 0x21;
            paiVar18 = paiVar17;
            do {
              iVar12 = local_f38.left_nz[lVar23];
              iVar4 = *(int *)(local_f38.i4_boundary + lVar26 * 4 + -0x50);
              (*VP8SetResidualCoeffs)(*paiVar18,&local_12d8);
              iVar12 = VP8RecordCoeffs(iVar12 + iVar4,&local_12d8);
              local_f38.left_nz[lVar23] = iVar12;
              *(int *)(local_f38.i4_boundary + lVar26 * 4 + -0x50) = iVar12;
              lVar26 = lVar26 + 1;
              paiVar18 = paiVar18 + 1;
            } while (lVar26 != 0x25);
            lVar23 = lVar23 + 1;
            paiVar17 = paiVar17 + 4;
          } while (lVar23 != 4);
          VP8InitResidual(0,2,pVVar8,&local_12d8);
          piVar22 = local_f38.top_nz + 4;
          paiVar17 = local_12a8.uv_levels;
          uVar29 = 0;
          do {
            paiVar18 = paiVar17;
            uVar25 = 0;
            do {
              uVar27 = uVar25 | uVar29 | 4;
              lVar23 = 0;
              paiVar19 = paiVar18;
              do {
                iVar12 = local_f38.left_nz[uVar27];
                iVar4 = piVar22[lVar23];
                (*VP8SetResidualCoeffs)(*paiVar19,&local_12d8);
                iVar12 = VP8RecordCoeffs(iVar12 + iVar4,&local_12d8);
                local_f38.left_nz[uVar27] = iVar12;
                piVar22[lVar23] = iVar12;
                lVar23 = lVar23 + 1;
                paiVar19 = paiVar19 + 1;
              } while (lVar23 == 1);
              paiVar18 = paiVar18 + 2;
              bVar31 = uVar25 == 0;
              uVar25 = uVar25 + 1;
            } while (bVar31);
            paiVar17 = paiVar17 + 4;
            piVar22 = piVar22 + 2;
            bVar31 = uVar29 == 0;
            uVar29 = uVar29 + 2;
          } while (bVar31);
          VP8IteratorBytesToNz(&local_f38);
          sVar7 = local_12a8.H;
          lVar24 = lVar24 + local_12a8.R;
          lVar20 = lVar20 + local_12a8.D;
          if ((iVar10 != 0) && (iVar12 = VP8IteratorProgress(&local_f38,iVar10), iVar12 == 0)) {
            uVar29 = 0;
            dVar32 = local_1320.value;
            goto LAB_00132ca4;
          }
          lVar24 = lVar24 + sVar7;
          lVar28 = lVar28 + sVar7;
          VP8IteratorSaveBoundary(&local_f38);
          iVar12 = VP8IteratorNext(&local_f38);
        } while ((iVar12 != 0) && (bVar31 = 1 < iVar11, iVar11 = iVar11 + -1, bVar31));
        uVar29 = lVar28 + (enc->segment_hdr).size;
        if (local_1320.do_size_search == 0) {
          dVar32 = 99.0;
          if (lVar20 != 0 && iVar15 != 0) {
            auVar34._8_4_ = (int)((ulong)lVar20 >> 0x20);
            auVar34._0_8_ = lVar20;
            auVar34._12_4_ = 0x45300000;
            dVar32 = log10(local_12e8 /
                           ((auVar34._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0)));
            dVar32 = dVar32 * 10.0;
          }
        }
        else {
          iVar11 = FinalizeSkipProba(enc);
          iVar12 = FinalizeTokenProbas(&enc->proba);
          dVar32 = (double)(((long)iVar12 + lVar24 + uVar29 + (long)iVar11 + 0x400 >> 0xb) + 0x1e);
        }
LAB_00132ca4:
        local_1320.value = dVar32;
        if (uVar29 == 0) {
          lVar20 = 1;
LAB_00132d38:
          iVar9 = (*(code *)((long)&DAT_001baef0 + (long)(int)(&DAT_001baef0)[lVar20]))();
          return iVar9;
        }
        if (uVar29 < 0x3fc00001 || enc->max_i4_header_bits < 1) {
          lVar20 = 3;
          if ((!bVar30) && ((iVar13 == 0 || (ComputeNextQ(&local_1320), 0.4 < ABS(local_1320.dq)))))
          {
            lVar20 = 0;
          }
          goto LAB_00132d38;
        }
        enc->max_i4_header_bits = (uint)enc->max_i4_header_bits >> 1;
      } while (0 < iVar14);
    }
    if ((iVar13 == 0) || (local_1320.do_size_search == 0)) {
      FinalizeSkipProba(enc);
      FinalizeTokenProbas(&enc->proba);
    }
    VP8CalculateLevelCosts(&enc->proba);
    WebPReportProgress(enc->pic,iVar3 + 0x14,&enc->percent);
    VP8IteratorInit(enc,&local_f38);
    VP8InitFilter(&local_f38);
    do {
      iVar9 = (enc->proba).use_skip_proba;
      rd_opt = enc->rd_opt_level;
      VP8IteratorImport(&local_f38,(uint8_t *)0x0);
      iVar13 = VP8Decimate(&local_f38,&local_12a8,rd_opt);
      bw = local_f38.bw;
      pVVar8 = local_f38.enc;
      if ((iVar13 == 0) || (iVar9 == 0)) {
        bVar2 = *(byte *)local_f38.mb;
        VP8IteratorNzToBytes(&local_f38);
        iVar9 = bw->nb_bits;
        sVar5 = bw->pos;
        iVar13 = bw->run;
        bVar30 = (bVar2 & 3) != 1;
        if (bVar30) {
          iVar14 = 3;
        }
        else {
          VP8InitResidual(0,1,pVVar8,(VP8Residual *)&local_1320);
          (*VP8SetResidualCoeffs)(local_12a8.y_dc_levels,(VP8Residual *)&local_1320);
          local_f38.top_nz[8] =
               PutCoeffs(bw,local_f38.left_nz[8] + local_f38.top_nz[8],(VP8Residual *)&local_1320);
          iVar14 = 0;
          local_f38.left_nz[8] = local_f38.top_nz[8];
        }
        VP8InitResidual((uint)!bVar30,iVar14,pVVar8,(VP8Residual *)&local_1320);
        paiVar17 = local_12a8.y_ac_levels;
        lVar20 = 0;
        do {
          lVar24 = 0x21;
          paiVar18 = paiVar17;
          do {
            iVar14 = local_f38.left_nz[lVar20];
            iVar3 = *(int *)(local_f38.i4_boundary + lVar24 * 4 + -0x50);
            (*VP8SetResidualCoeffs)(*paiVar18,(VP8Residual *)&local_1320);
            iVar14 = PutCoeffs(bw,iVar14 + iVar3,(VP8Residual *)&local_1320);
            local_f38.left_nz[lVar20] = iVar14;
            *(int *)(local_f38.i4_boundary + lVar24 * 4 + -0x50) = iVar14;
            lVar24 = lVar24 + 1;
            paiVar18 = paiVar18 + 1;
          } while (lVar24 != 0x25);
          lVar20 = lVar20 + 1;
          paiVar17 = paiVar17 + 4;
        } while (lVar20 != 4);
        iVar14 = bw->nb_bits;
        sVar6 = bw->pos;
        iVar3 = bw->run;
        VP8InitResidual(0,2,pVVar8,(VP8Residual *)&local_1320);
        piVar22 = local_f38.top_nz + 4;
        paiVar17 = local_12a8.uv_levels;
        uVar29 = 0;
        do {
          uVar25 = 0;
          paiVar18 = paiVar17;
          do {
            uVar27 = uVar25 | uVar29 | 4;
            lVar20 = 0;
            paiVar19 = paiVar18;
            do {
              iVar15 = local_f38.left_nz[uVar27];
              iVar10 = piVar22[lVar20];
              (*VP8SetResidualCoeffs)(*paiVar19,(VP8Residual *)&local_1320);
              iVar15 = PutCoeffs(bw,iVar15 + iVar10,(VP8Residual *)&local_1320);
              local_f38.left_nz[uVar27] = iVar15;
              piVar22[lVar20] = iVar15;
              lVar20 = lVar20 + 1;
              paiVar19 = paiVar19 + 1;
            } while (lVar20 == 1);
            paiVar18 = paiVar18 + 2;
            bVar30 = uVar25 == 0;
            uVar25 = uVar25 + 1;
          } while (bVar30);
          paiVar17 = paiVar17 + 4;
          piVar22 = piVar22 + 2;
          bVar30 = uVar29 == 0;
          uVar29 = uVar29 + 2;
        } while (bVar30);
        lVar20 = (long)iVar14 + (sVar6 + (long)iVar3) * 8 + 8;
        uVar21 = bVar2 >> 5 & 3;
        local_f38.luma_bits = (lVar20 - ((long)iVar9 + (sVar5 + (long)iVar13) * 8)) - 8;
        uVar16 = (bw->nb_bits - lVar20) + ((long)bw->run + bw->pos) * 8 + 8;
        local_f38.uv_bits = uVar16;
        puVar1 = local_f38.bit_count[uVar21] + ((bVar2 & 3) == 1);
        *puVar1 = *puVar1 + local_f38.luma_bits;
        puVar1 = local_f38.bit_count[uVar21] + 2;
        *puVar1 = *puVar1 + uVar16;
        VP8IteratorBytesToNz(&local_f38);
        if ((local_f38.bw)->error == 0) goto LAB_0013314e;
        iVar9 = 0;
        bVar30 = true;
      }
      else {
        if (((uint)*local_f38.mb & 3) == 1) {
          *local_f38.nz = 0;
          local_f38.left_nz[8] = 0;
        }
        else {
          *local_f38.nz = *local_f38.nz & 0x1000000;
        }
LAB_0013314e:
        StoreSideInfo(&local_f38);
        VP8StoreFilterStats(&local_f38);
        VP8IteratorExport(&local_f38);
        iVar9 = VP8IteratorProgress(&local_f38,0x14);
        VP8IteratorSaveBoundary(&local_f38);
        bVar30 = false;
      }
    } while (((!bVar30) && (iVar9 != 0)) && (iVar13 = VP8IteratorNext(&local_f38), iVar13 != 0));
    iVar9 = PostLoopFinalize(&local_f38,iVar9);
  }
  return iVar9;
}

Assistant:

int VP8EncLoop(VP8Encoder* const enc) {
  VP8EncIterator it;
  int ok = PreLoopInitialize(enc);
  if (!ok) return 0;

  StatLoop(enc);  // stats-collection loop

  VP8IteratorInit(enc, &it);
  VP8InitFilter(&it);
  do {
    VP8ModeScore info;
    const int dont_use_skip = !enc->proba.use_skip_proba;
    const VP8RDLevel rd_opt = enc->rd_opt_level;

    VP8IteratorImport(&it, NULL);
    // Warning! order is important: first call VP8Decimate() and
    // *then* decide how to code the skip decision if there's one.
    if (!VP8Decimate(&it, &info, rd_opt) || dont_use_skip) {
      CodeResiduals(it.bw, &it, &info);
      if (it.bw->error) {
        // enc->pic->error_code is set in PostLoopFinalize().
        ok = 0;
        break;
      }
    } else {   // reset predictors after a skip
      ResetAfterSkip(&it);
    }
    StoreSideInfo(&it);
    VP8StoreFilterStats(&it);
    VP8IteratorExport(&it);
    ok = VP8IteratorProgress(&it, 20);
    VP8IteratorSaveBoundary(&it);
  } while (ok && VP8IteratorNext(&it));

  return PostLoopFinalize(&it, ok);
}